

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O1

int SearchCut(Situation *situation,int depth,int beta,bool allowNullMove)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar5;
  undefined4 uVar7;
  Movement hash_move;
  Movement move;
  undefined4 uVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  clock_t cVar13;
  long lVar14;
  undefined4 uVar15;
  Movement *all_movements;
  Movement move_00;
  int move_num;
  Movement move_list [128];
  int local_670;
  Movement local_668;
  int local_658;
  int local_654;
  int local_650;
  int local_64c;
  ulong local_648;
  undefined1 local_640 [1552];
  undefined6 uVar4;
  undefined5 uVar6;
  
  local_668.from = '\0';
  local_668.to = '\0';
  local_668.capture = '\0';
  local_668._3_1_ = 0;
  local_668.value = 0;
  local_668.catc = '\0';
  local_668.movec = '\0';
  local_668._10_2_ = 0;
  if (depth < 1) {
    iVar12 = QuiescentSearch(situation,beta + -1,beta);
    return iVar12;
  }
  local_640[0] = '\0';
  local_640[1] = '\0';
  local_640[2] = '\0';
  local_640[3] = 0;
  local_640._4_4_ = 0;
  iVar12 = beta;
  if (step + -10000 < beta) {
    local_650 = beta + -1;
    iVar12 = ReadHashTable(depth,local_650,beta,&local_668);
    if (iVar12 == 0x100000) {
      if ((allowNullMove && 0xfa < situation->value[situation->current_player]) &&
         (bVar10 = BeChecked(situation), !bVar10)) {
        MakeNullMove(situation);
        iVar12 = SearchCut(situation,depth + -3,1 - beta,false);
        UnMakeNullMove(situation);
        if ((beta <= -iVar12) &&
           (iVar12 = SearchCut(situation,depth + -2,beta,false), beta <= iVar12)) {
          iVar12 = 2;
          if (2 < depth) {
            iVar12 = depth;
          }
          SaveHashTable(iVar12,beta,'\x02',(Movement)ZEXT812((ulong)0));
          return beta;
        }
      }
      if ((isTimeLimit == false) && (cVar13 = clock(), cVar13 - StartTime < 0x9c41)) {
        local_64c = 0;
        hash_move.to = local_668.to;
        hash_move.from = local_668.from;
        hash_move.capture = local_668.capture;
        hash_move._3_1_ = local_668._3_1_;
        hash_move.value = local_668.value;
        hash_move.catc = local_668.catc;
        hash_move.movec = local_668.movec;
        hash_move._10_2_ = local_668._10_2_;
        all_movements = (Movement *)(local_640 + 8);
        MoveSort(situation,&local_64c,all_movements,hash_move,step);
        bVar10 = 0 < local_64c;
        local_648 = (ulong)(uint)depth;
        if (local_64c < 1) {
          uVar15._0_1_ = '\0';
          uVar15._1_1_ = '\0';
          uVar15._2_2_ = 0;
        }
        else {
          local_670 = -0x100000;
          local_654 = depth + -1;
          local_658 = 1 - beta;
          lVar14 = 0;
          uVar15._0_1_ = '\0';
          uVar15._1_1_ = '\0';
          uVar15._2_2_ = 0;
          do {
            uVar1 = all_movements->from;
            uVar2 = all_movements->to;
            uVar3 = all_movements->capture;
            uVar5 = all_movements->field_0x3;
            uVar7 = all_movements->value;
            uVar6 = CONCAT41(uVar7,uVar5);
            uVar4 = CONCAT51(uVar6,uVar3);
            local_668.catc = all_movements->catc;
            local_668.movec = all_movements->movec;
            local_668._10_2_ = *(undefined2 *)&all_movements->field_0xa;
            local_668.from = uVar1;
            local_668.to = uVar2;
            local_668._2_6_ = uVar4;
            if (uVar1 != '\0' || uVar2 != '\0') {
              bVar11 = MakeAMove(situation,&local_668,false);
              if (bVar11) {
                iVar12 = step + -10000;
              }
              else {
                iVar12 = SearchCut(situation,local_654,local_658,true);
                iVar12 = -iVar12;
              }
              UnMakeAMove(situation);
              uVar8 = local_668._8_4_;
              if ((local_670 < iVar12) &&
                 (local_640[1] = local_668.to, local_640[0] = local_668.from,
                 local_640[2] = local_668.capture, local_640[3] = local_668._3_1_,
                 local_640._4_4_ = local_668.value, uVar15 = local_668._8_4_, local_670 = iVar12,
                 beta <= iVar12)) {
                iVar12 = (int)local_648;
                SetBestMove(&local_668,step,iVar12);
                move.to = local_668.to;
                move.from = local_668.from;
                move.capture = local_668.capture;
                move._3_1_ = local_668._3_1_;
                move.value = local_668.value;
                move.catc = local_668.catc;
                move.movec = local_668.movec;
                move._10_2_ = local_668._10_2_;
                SaveHashTable(iVar12,beta,'\x02',move);
                uVar15 = uVar8;
                break;
              }
            }
            lVar14 = lVar14 + 1;
            all_movements = all_movements + 1;
            bVar10 = lVar14 < local_64c;
          } while (lVar14 < local_64c);
        }
        iVar9 = local_650;
        iVar12 = beta;
        if (!bVar10) {
          move_00.catc = (UINT8)uVar15;
          move_00.movec = SUB41(uVar15,1);
          move_00._10_2_ = SUB42(uVar15,2);
          move_00.from = local_640[0];
          move_00.to = local_640[1];
          move_00.capture = local_640[2];
          move_00._3_1_ = local_640[3];
          move_00.value = local_640._4_4_;
          SaveHashTable((int)local_648,local_650,'\x01',move_00);
          iVar12 = iVar9;
        }
      }
      else {
        isTimeLimit = true;
        iVar12 = 0x100000;
      }
    }
  }
  return iVar12;
}

Assistant:

int SearchCut(Situation& situation, int depth, int beta, bool allowNullMove = false){
    int value;                      // 下一着法的分值
    int best;                       // 所有着法中的最佳分值
    Movement move_list[128];        // 当前所有着法
    Movement move;                  // 当前着法
    Movement good_move;             // 当前局面最佳着法
    move = good_move = NONE_MOVE;
    best = -NONE_VALUE;

    // 到达搜索深度
    if(depth <= 0){
        // 静态搜索评估
        return QuiescentSearch(situation, beta - 1, beta);
    }

    if(step - MAX_VALUE >= beta)
        return beta;

    // 置换表裁剪
    value = ReadHashTable(depth, beta - 1, beta, move);
    if(value != NONE_VALUE){
        return value;
    }

    // 空着裁剪(带检验)
    if(!BanNullMove(situation) && allowNullMove && !BeChecked(situation)){
        MakeNullMove(situation);
        value = -SearchCut(situation, depth - 1 - NULL_REDUCTION, 1 - beta);
        UnMakeNullMove(situation);

        if(value >= beta && SearchCut(situation, depth - NULL_REDUCTION, beta) >= beta){
            SaveHashTable(max(depth, NULL_REDUCTION), beta, hashBETA, NONE_MOVE);
            return beta;
        }
    }

    // 时间检测，避免超限
    if(isTimeLimit || clock() - StartTime > MAX_TIME){
        isTimeLimit = 1;
        return NONE_VALUE;
    }

    int move_num = 0;       // 着法数量
    // 生成着法
    MoveSort(situation, move_num, move_list, move, step);
    for(int i = 0; i < move_num; i++){
        move = move_list[i];
        if(move.from == 0 && move.to == 0) continue;
        // 下子
        if(MakeAMove(situation, move)){
            value = -MAX_VALUE + step;
        }
        else{
            value = -SearchCut(situation, depth - 1, 1 - beta, true);
        }
        // 回溯
        UnMakeAMove(situation);

        if(value > best){
            best = value;           // 更新最佳分数
            good_move = move;       // 更新最佳着法
            if(value >= beta){
                // 此着法是好着法，记录进历史表和杀手表
                SetBestMove(move, step, depth);
                SaveHashTable(depth, beta, hashBETA, move);
                return beta;
            }
        }
    }

    SaveHashTable(depth, beta - 1, hashALPHA, good_move);
    return beta - 1;
}